

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

ExecutionResult __thiscall nigel::Lexer::postLexer(Lexer *this,CodeBase *base)

{
  char cVar1;
  int iVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _List_node_base *p_Var5;
  bool bVar6;
  _List_node_base *p_Var7;
  Lexer *pLVar8;
  list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_> *this_00;
  bool bVar9;
  size_t sStack_2f0;
  iterator local_2e0;
  __shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> local_2d8;
  undefined1 local_2c8 [32];
  String identifier_2;
  String identifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  list<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
  toRemove;
  shared_ptr<nigel::Token> tmp2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  toRemove.
  super__List_base<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&toRemove;
  toRemove.
  super__List_base<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&toRemove;
  toRemove.
  super__List_base<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_2d8._M_ptr = (element_type *)0x0;
  local_2d8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &base->lexerStruct;
  local_2e0._M_node = (_List_node_base *)this_00;
  do {
    local_2e0._M_node =
         (((_List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
            *)&(local_2e0._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    p_Var7 = (_List_node_base *)&toRemove;
    if (local_2e0._M_node == (_List_node_base *)this_00) {
      while (p_Var7 = (((list<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
                         *)p_Var7)->
                      super__List_base<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
                      )._M_impl._M_node.super__List_node_base._M_next,
            p_Var7 != (_List_node_base *)&toRemove) {
        std::__cxx11::
        list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>::erase
                  (this_00,p_Var7[1]._M_next);
      }
      std::__cxx11::
      _List_base<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
      ::_M_clear(&toRemove.
                  super__List_base<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tmp2.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2d8._M_refcount);
      return success;
    }
    iVar2 = *(int *)&local_2e0._M_node[1]._M_next[1]._M_prev;
    if (iVar2 != 0x3b) {
      if (iVar2 == 0x18) {
        Token::as<nigel::Token_Operator>((Token *)&identifier_2);
        std::__cxx11::string::string
                  ((string *)&identifier,
                   (string *)
                   (CONCAT44(identifier_2._M_dataplus._M_p._4_4_,identifier_2._M_dataplus._M_p._0_4_
                            ) + 0x50));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&identifier_2._M_string_length);
        if (1 < identifier._M_string_length) {
          std::__cxx11::string::substr((ulong)&identifier_2,(ulong)&identifier);
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&identifier_2,"<<=");
          pLVar8 = (Lexer *)&identifier_2;
          if (bVar6) {
            std::__cxx11::string::~string((string *)&identifier_2);
LAB_001739d6:
            bVar6 = identifier._M_string_length < 3;
            bVar9 = identifier._M_string_length == 3;
            sStack_2f0 = 3;
LAB_001739de:
            if (!bVar6 && !bVar9) {
LAB_001739e1:
              splitToken(pLVar8,&identifier,sStack_2f0,&local_2e0,this_00);
            }
          }
          else {
            std::__cxx11::string::substr((ulong)local_2c8,(ulong)&identifier);
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_2c8,">>=");
            std::__cxx11::string::~string((string *)local_2c8);
            std::__cxx11::string::~string((string *)&identifier_2);
            if (bVar6) goto LAB_001739d6;
            std::__cxx11::string::substr((ulong)&identifier_2,(ulong)&identifier);
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier_2,"&&");
            if (!bVar6) {
              std::__cxx11::string::substr((ulong)local_2c8,(ulong)&identifier);
              bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_2c8,"||");
              bVar9 = true;
              if (!bVar6) {
                std::__cxx11::string::substr((ulong)&local_260,(ulong)&identifier);
                bVar6 = std::operator==(&local_260,"<<");
                bVar9 = true;
                if (!bVar6) {
                  std::__cxx11::string::substr((ulong)&local_70,(ulong)&identifier);
                  bVar6 = std::operator==(&local_70,">>");
                  bVar9 = true;
                  if (!bVar6) {
                    std::__cxx11::string::substr((ulong)&local_90,(ulong)&identifier);
                    bVar6 = std::operator==(&local_90,">=");
                    bVar9 = true;
                    if (!bVar6) {
                      std::__cxx11::string::substr((ulong)&local_b0,(ulong)&identifier);
                      bVar6 = std::operator==(&local_b0,"<=");
                      bVar9 = true;
                      if (!bVar6) {
                        std::__cxx11::string::substr((ulong)&local_d0,(ulong)&identifier);
                        bVar6 = std::operator==(&local_d0,"++");
                        bVar9 = true;
                        if (!bVar6) {
                          std::__cxx11::string::substr((ulong)&local_f0,(ulong)&identifier);
                          bVar6 = std::operator==(&local_f0,"--");
                          bVar9 = true;
                          if (!bVar6) {
                            std::__cxx11::string::substr((ulong)&local_110,(ulong)&identifier);
                            bVar6 = std::operator==(&local_110,"==");
                            bVar9 = true;
                            if (!bVar6) {
                              std::__cxx11::string::substr((ulong)&local_130,(ulong)&identifier);
                              bVar6 = std::operator==(&local_130,"!=");
                              bVar9 = true;
                              if (!bVar6) {
                                std::__cxx11::string::substr((ulong)&local_150,(ulong)&identifier);
                                bVar6 = std::operator==(&local_150,"+=");
                                bVar9 = true;
                                if (!bVar6) {
                                  std::__cxx11::string::substr((ulong)&local_170,(ulong)&identifier)
                                  ;
                                  bVar6 = std::operator==(&local_170,"-=");
                                  bVar9 = true;
                                  if (!bVar6) {
                                    std::__cxx11::string::substr
                                              ((ulong)&local_190,(ulong)&identifier);
                                    bVar6 = std::operator==(&local_190,"*=");
                                    bVar9 = true;
                                    if (!bVar6) {
                                      std::__cxx11::string::substr
                                                ((ulong)&local_1b0,(ulong)&identifier);
                                      bVar6 = std::operator==(&local_1b0,"/=");
                                      bVar9 = true;
                                      if (!bVar6) {
                                        std::__cxx11::string::substr
                                                  ((ulong)&local_1d0,(ulong)&identifier);
                                        bVar6 = std::operator==(&local_1d0,"%=");
                                        bVar9 = true;
                                        if (!bVar6) {
                                          std::__cxx11::string::substr
                                                    ((ulong)&local_1f0,(ulong)&identifier);
                                          bVar6 = std::operator==(&local_1f0,"&=");
                                          bVar9 = true;
                                          if (!bVar6) {
                                            std::__cxx11::string::substr
                                                      ((ulong)&local_210,(ulong)&identifier);
                                            bVar6 = std::operator==(&local_210,"|=");
                                            bVar9 = true;
                                            if (!bVar6) {
                                              std::__cxx11::string::substr
                                                        ((ulong)&local_50,(ulong)&identifier);
                                              bVar9 = std::operator==(&local_50,"^=");
                                              std::__cxx11::string::~string((string *)&local_50);
                                            }
                                            std::__cxx11::string::~string((string *)&local_210);
                                          }
                                          std::__cxx11::string::~string((string *)&local_1f0);
                                        }
                                        std::__cxx11::string::~string((string *)&local_1d0);
                                      }
                                      std::__cxx11::string::~string((string *)&local_1b0);
                                    }
                                    std::__cxx11::string::~string((string *)&local_190);
                                  }
                                  std::__cxx11::string::~string((string *)&local_170);
                                }
                                std::__cxx11::string::~string((string *)&local_150);
                              }
                              std::__cxx11::string::~string((string *)&local_130);
                            }
                            std::__cxx11::string::~string((string *)&local_110);
                          }
                          std::__cxx11::string::~string((string *)&local_f0);
                        }
                        std::__cxx11::string::~string((string *)&local_d0);
                      }
                      std::__cxx11::string::~string((string *)&local_b0);
                    }
                    std::__cxx11::string::~string((string *)&local_90);
                  }
                  std::__cxx11::string::~string((string *)&local_70);
                }
                std::__cxx11::string::~string((string *)&local_260);
              }
              std::__cxx11::string::~string((string *)local_2c8);
              pLVar8 = (Lexer *)&identifier_2;
              std::__cxx11::string::~string((string *)&identifier_2);
              if (bVar9 == false) goto LAB_001739f1;
              bVar6 = identifier._M_string_length < 2;
              bVar9 = identifier._M_string_length == 2;
              sStack_2f0 = 2;
              goto LAB_001739de;
            }
            pLVar8 = (Lexer *)&identifier_2;
            std::__cxx11::string::~string((string *)&identifier_2);
            sStack_2f0 = 2;
            if (2 < identifier._M_string_length) goto LAB_001739e1;
          }
LAB_001739f1:
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&identifier,"+=");
          if (bVar6) {
            local_2c8._0_4_ = op_add_set;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
LAB_00174558:
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&local_2d8,
                       (__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)&identifier_2);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&identifier_2._M_string_length)
            ;
            peVar3 = (element_type *)local_2e0._M_node[1]._M_next;
            local_2e0._M_node[1]._M_next = (_List_node_base *)local_2d8._M_ptr;
            local_2d8._M_ptr = peVar3;
          }
          else {
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier,"-=");
            if (bVar6) {
              local_2c8._0_4_ = op_sub_set;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
              goto LAB_00174558;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier,"*=");
            if (bVar6) {
              local_2c8._0_4_ = op_mul_set;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
              goto LAB_00174558;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier,"/=");
            if (bVar6) {
              local_2c8._0_4_ = op_div_set;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
              goto LAB_00174558;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier,"%=");
            if (bVar6) {
              local_2c8._0_4_ = op_mod_set;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
              goto LAB_00174558;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier,"==");
            if (bVar6) {
              local_2c8._0_4_ = op_eql;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
              goto LAB_00174558;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier,"!=");
            if (bVar6) {
              local_2c8._0_4_ = op_not_eql;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
              goto LAB_00174558;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier,"<=");
            if (bVar6) {
              local_2c8._0_4_ = op_less_eql;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
              goto LAB_00174558;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier,">=");
            if (bVar6) {
              local_2c8._0_4_ = op_more_eql;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
              goto LAB_00174558;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier,"&=");
            if (bVar6) {
              local_2c8._0_4_ = op_and_set;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
              goto LAB_00174558;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier,"|=");
            if (bVar6) {
              local_2c8._0_4_ = op_or_set;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
              goto LAB_00174558;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier,"^=");
            if (bVar6) {
              local_2c8._0_4_ = op_xor_set;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
              goto LAB_00174558;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier,"&&");
            if (bVar6) {
              local_2c8._0_4_ = op_and_log;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
              goto LAB_00174558;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier,"||");
            if (bVar6) {
              local_2c8._0_4_ = op_or_log;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
              goto LAB_00174558;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier,"<<");
            if (bVar6) {
              local_2c8._0_4_ = op_shift_left;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
              goto LAB_00174558;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier,">>");
            if (bVar6) {
              local_2c8._0_4_ = op_shift_right;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
            }
            else {
              bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&identifier,"<<=");
              if (bVar6) {
                local_2c8._0_4_ = op_shift_left_set;
                std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
              }
              else {
                bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&identifier,">>=");
                if (bVar6) {
                  local_2c8._0_4_ = op_shift_right_set;
                  std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
                }
                else {
                  bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&identifier,"++");
                  if (bVar6) {
                    local_2c8._0_4_ = op_inc;
                    std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
                  }
                  else {
                    pLVar8 = (Lexer *)&identifier;
                    bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&identifier,"--");
                    if (!bVar6) {
                      splitToken(pLVar8,&identifier,1,&local_2e0,this_00);
                      goto LAB_0017459b;
                    }
                    local_2c8._0_4_ = op_dec;
                    std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
                  }
                }
              }
            }
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&local_2d8,
                       (__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)&identifier_2);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&identifier_2._M_string_length)
            ;
            peVar3 = (element_type *)local_2e0._M_node[1]._M_next;
            local_2e0._M_node[1]._M_next = (_List_node_base *)local_2d8._M_ptr;
            local_2d8._M_ptr = peVar3;
          }
          p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_node[1]._M_prev;
          local_2e0._M_node[1]._M_prev = (_List_node_base *)local_2d8._M_refcount._M_pi;
          local_2d8._M_refcount._M_pi = p_Var4;
        }
LAB_0017459b:
        if (identifier._M_string_length == 1) {
          Token::as<nigel::Token_Operator>((Token *)local_2c8);
          std::__cxx11::string::string
                    ((string *)&identifier_2,
                     (string *)(CONCAT44(local_2c8._4_4_,local_2c8._0_4_) + 0x50));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2c8 + 8));
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&identifier_2,"+");
          if (bVar6) {
            local_260._M_dataplus._M_p._0_4_ = 0x19;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)local_2c8);
LAB_001748a0:
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&local_2d8,
                       (__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)local_2c8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2c8 + 8));
            peVar3 = (element_type *)local_2e0._M_node[1]._M_next;
            local_2e0._M_node[1]._M_next = (_List_node_base *)local_2d8._M_ptr;
            p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_node[1]._M_prev;
            local_2e0._M_node[1]._M_prev = (_List_node_base *)local_2d8._M_refcount._M_pi;
            local_2d8._M_ptr = peVar3;
            local_2d8._M_refcount._M_pi = p_Var4;
          }
          else {
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier_2,"-");
            if (bVar6) {
              local_260._M_dataplus._M_p._0_4_ = 0x1a;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)local_2c8);
              goto LAB_001748a0;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier_2,"*");
            if (bVar6) {
              local_260._M_dataplus._M_p._0_4_ = 0x1b;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)local_2c8);
              goto LAB_001748a0;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier_2,"/");
            if (bVar6) {
              local_260._M_dataplus._M_p._0_4_ = 0x1c;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)local_2c8);
              goto LAB_001748a0;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier_2,"%");
            if (bVar6) {
              local_260._M_dataplus._M_p._0_4_ = 0x1d;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)local_2c8);
              goto LAB_001748a0;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier_2,"=");
            if (bVar6) {
              local_260._M_dataplus._M_p._0_4_ = 0x2d;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)local_2c8);
              goto LAB_001748a0;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier_2,"<");
            if (bVar6) {
              local_260._M_dataplus._M_p._0_4_ = 0x20;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)local_2c8);
              goto LAB_001748a0;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier_2,">");
            if (bVar6) {
              local_260._M_dataplus._M_p._0_4_ = 0x21;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)local_2c8);
              goto LAB_001748a0;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier_2,"!");
            if (bVar6) {
              local_260._M_dataplus._M_p._0_4_ = 0x26;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)local_2c8);
              goto LAB_001748a0;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier_2,"&");
            if (bVar6) {
              local_260._M_dataplus._M_p._0_4_ = 0x27;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)local_2c8);
              goto LAB_001748a0;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier_2,"|");
            if (bVar6) {
              local_260._M_dataplus._M_p._0_4_ = 0x29;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)local_2c8);
              goto LAB_001748a0;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier_2,"^");
            if (bVar6) {
              local_260._M_dataplus._M_p._0_4_ = 0x2b;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)local_2c8);
              goto LAB_001748a0;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier_2,"~");
            if (bVar6) {
              local_260._M_dataplus._M_p._0_4_ = 0x2c;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)local_2c8);
              goto LAB_001748a0;
            }
          }
          std::__cxx11::string::~string((string *)&identifier_2);
        }
      }
      else {
        if (iVar2 != 3) goto switchD_001738c0_caseD_5e;
        Token::as<nigel::Token_Identifier>((Token *)&identifier_2);
        std::__cxx11::string::string
                  ((string *)&identifier,
                   (string *)
                   (CONCAT44(identifier_2._M_dataplus._M_p._4_4_,identifier_2._M_dataplus._M_p._0_4_
                            ) + 0x50));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&identifier_2._M_string_length);
        bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&identifier,"_EOF_");
        if (bVar6) {
          local_2c8._0_4_ = eof;
          std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
LAB_001744e9:
          std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&local_2d8,
                     (__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)&identifier_2);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&identifier_2._M_string_length);
          peVar3 = (element_type *)local_2e0._M_node[1]._M_next;
          local_2e0._M_node[1]._M_next = (_List_node_base *)local_2d8._M_ptr;
          local_2d8._M_ptr = peVar3;
        }
        else {
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&identifier,"fn");
          if (bVar6) {
            local_2c8._0_4_ = function;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
            goto LAB_001744e9;
          }
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&identifier,"byte");
          if (bVar6) {
            local_2c8._0_4_ = type_byte;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
            goto LAB_001744e9;
          }
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&identifier,"int");
          if (bVar6) {
            local_2c8._0_4_ = type_int;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
            goto LAB_001744e9;
          }
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&identifier,"unsigned");
          if (bVar6) {
            local_2c8._0_4_ = unsigned_attr;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
            goto LAB_001744e9;
          }
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&identifier,"fast");
          if (bVar6) {
            local_2c8._0_4_ = fast_attr;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
            goto LAB_001744e9;
          }
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&identifier,"norm");
          if (bVar6) {
            local_2c8._0_4_ = norm_attr;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
            goto LAB_001744e9;
          }
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&identifier,"ptr");
          if (bVar6) {
            local_2c8._0_4_ = type_ptr;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
            goto LAB_001744e9;
          }
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&identifier,"if");
          if (bVar6) {
            local_2c8._0_4_ = cf_if;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
            goto LAB_001744e9;
          }
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&identifier,"else");
          if (bVar6) {
            local_2c8._0_4_ = cf_else;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
            goto LAB_001744e9;
          }
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&identifier,"while");
          if (bVar6) {
            local_2c8._0_4_ = cf_while;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
            goto LAB_001744e9;
          }
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&identifier,"for");
          if (bVar6) {
            local_2c8._0_4_ = cf_for;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
            goto LAB_001744e9;
          }
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&identifier,"do");
          if (bVar6) {
            local_2c8._0_4_ = cf_do;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
            goto LAB_001744e9;
          }
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&identifier,"break");
          if (bVar6) {
            local_2c8._0_4_ = cf_break;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
            goto LAB_001744e9;
          }
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&identifier,"return");
          if (bVar6) {
            local_2c8._0_4_ = cf_return;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
            goto LAB_001744e9;
          }
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&identifier,"new");
          if (bVar6) {
            local_2c8._0_4_ = dy_new;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
            goto LAB_001744e9;
          }
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&identifier,"delete");
          if (!bVar6) {
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier,"true");
            if (bVar6) {
              local_2c8._0_4_ = literalTrue;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
              goto LAB_00174a6c;
            }
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&identifier,"false");
            if (bVar6) {
              local_2c8._0_4_ = literalFalse;
              std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
              goto LAB_00174a6c;
            }
            goto LAB_001748ee;
          }
          local_2c8._0_4_ = dy_delete;
          std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier_2);
LAB_00174a6c:
          std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&local_2d8,
                     (__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)&identifier_2);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&identifier_2._M_string_length);
          peVar3 = (element_type *)local_2e0._M_node[1]._M_next;
          local_2e0._M_node[1]._M_next = (_List_node_base *)local_2d8._M_ptr;
          local_2d8._M_ptr = peVar3;
        }
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_node[1]._M_prev;
        local_2e0._M_node[1]._M_prev = (_List_node_base *)local_2d8._M_refcount._M_pi;
        local_2d8._M_refcount._M_pi = p_Var4;
      }
LAB_001748ee:
      std::__cxx11::string::~string((string *)&identifier);
      goto switchD_001738c0_caseD_5e;
    }
    Token::as<nigel::Token_DividingToken>((Token *)&identifier);
    cVar1 = identifier._M_dataplus._M_p[0x50];
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&identifier._M_string_length);
    switch(cVar1) {
    case '#':
      identifier_2._M_dataplus._M_p._0_4_ = 0x3d;
      std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier);
      break;
    case '$':
      identifier_2._M_dataplus._M_p._0_4_ = 0x3c;
      std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier);
      break;
    case '%':
    case '&':
    case '\'':
    case '*':
    case '+':
    case '-':
      goto switchD_001738c0_caseD_5e;
    case '(':
      identifier_2._M_dataplus._M_p._0_4_ = 0x3e;
      std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier);
      break;
    case ')':
      identifier_2._M_dataplus._M_p._0_4_ = 0x3f;
      std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier);
      break;
    case ',':
      identifier_2._M_dataplus._M_p._0_4_ = 0x44;
      std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier);
      break;
    case '.':
      identifier_2._M_dataplus._M_p._0_4_ = 0x45;
      std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier);
      break;
    default:
      switch(cVar1) {
      case ':':
        identifier_2._M_dataplus._M_p._0_4_ = 0x46;
        std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier);
        break;
      case ';':
        identifier_2._M_dataplus._M_p._0_4_ = 0x47;
        std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier);
        break;
      case '<':
      case '=':
      case '>':
        goto switchD_001738c0_caseD_5e;
      case '?':
        identifier_2._M_dataplus._M_p._0_4_ = 0x48;
        std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier);
        break;
      case '@':
        identifier_2._M_dataplus._M_p._0_4_ = 0x49;
        std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier);
        break;
      default:
        switch(cVar1) {
        case '[':
          identifier_2._M_dataplus._M_p._0_4_ = 0x40;
          std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier);
          break;
        case '\\':
          identifier_2._M_dataplus._M_p._0_4_ = 0x4a;
          std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier);
          break;
        case ']':
          identifier_2._M_dataplus._M_p._0_4_ = 0x41;
          std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier);
          break;
        case '^':
        case '_':
          goto switchD_001738c0_caseD_5e;
        case '`':
          identifier_2._M_dataplus._M_p._0_4_ = 0x4b;
          std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier);
          break;
        default:
          if (cVar1 == '{') {
            identifier_2._M_dataplus._M_p._0_4_ = 0x42;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier);
            std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&local_2d8,
                       (__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)&identifier);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&identifier._M_string_length);
            peVar3 = (element_type *)local_2e0._M_node[1]._M_next;
            p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_node[1]._M_prev;
            local_2e0._M_node[1]._M_next = (_List_node_base *)local_2d8._M_ptr;
            local_2e0._M_node[1]._M_prev = (_List_node_base *)local_2d8._M_refcount._M_pi;
            local_2d8._M_ptr = peVar3;
            local_2d8._M_refcount._M_pi = p_Var4;
          }
          else if (cVar1 == '}') {
            identifier_2._M_dataplus._M_p._0_4_ = 0x43;
            std::make_shared<nigel::Token,nigel::Token::Type>((Type *)&identifier);
            break;
          }
          goto switchD_001738c0_caseD_5e;
        }
      }
    }
    std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_2d8,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)&identifier);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&identifier._M_string_length);
    peVar3 = (element_type *)local_2e0._M_node[1]._M_next;
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_node[1]._M_prev;
    local_2e0._M_node[1]._M_next = (_List_node_base *)local_2d8._M_ptr;
    local_2e0._M_node[1]._M_prev = (_List_node_base *)local_2d8._M_refcount._M_pi;
    local_2d8._M_ptr = peVar3;
    local_2d8._M_refcount._M_pi = p_Var4;
switchD_001738c0_caseD_5e:
    if (local_2d8._M_ptr != (element_type *)0x0) {
      p_Var7 = local_2e0._M_node[1]._M_next;
      p_Var5 = (_List_node_base *)(local_2d8._M_ptr)->columnNo;
      p_Var7[2]._M_next = (_List_node_base *)(local_2d8._M_ptr)->lineNo;
      p_Var7[2]._M_prev = p_Var5;
      std::
      __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ::operator=((__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   *)(p_Var7 + 3),
                  &((local_2d8._M_ptr)->line).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 );
      std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_2e0._M_node[1]._M_next + 4),
                 &((local_2d8._M_ptr)->path).
                  super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>);
    }
    identifier._M_dataplus._M_p = (pointer)0x0;
    identifier._M_string_length = 0;
    std::__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_2d8,(__shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2> *)&identifier);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&identifier._M_string_length);
    if (*(int *)&local_2e0._M_node[1]._M_next[1]._M_prev == 0) {
      std::__cxx11::
      list<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
      ::push_back(&toRemove,&local_2e0);
    }
  } while( true );
}

Assistant:

ExecutionResult Lexer::postLexer( CodeBase &base )
	{
		std::shared_ptr<Token> tmp, tmp2;
		std::list<std::list<std::shared_ptr<Token>>::iterator> toRemove;

		for( auto token = base.lexerStruct.begin() ; token != base.lexerStruct.end() ; token++ )
		{
			if( ( *token )->type == Token::Type::identifier )
			{//Specify some tokens in more detail
				String identifier = ( *token )->as<Token_Identifier>()->identifier;

				if( identifier == "_EOF_" )
				{
					tmp = std::make_shared<Token>( Token::Type::eof );
					token->swap( tmp );
				}
				else if( identifier == "fn" )
				{
					tmp = std::make_shared<Token>( Token::Type::function );
					token->swap( tmp );
				}
				else if( identifier == "byte" )
				{
					tmp = std::make_shared<Token>( Token::Type::type_byte );
					token->swap( tmp );
				}
				else if( identifier == "int" )
				{
					tmp = std::make_shared<Token>( Token::Type::type_int );
					token->swap( tmp );
				}
				else if( identifier == "unsigned" )
				{
					tmp = std::make_shared<Token>( Token::Type::unsigned_attr );
					token->swap( tmp );
				}
				else if( identifier == "fast" )
				{
					tmp = std::make_shared<Token>( Token::Type::fast_attr );
					token->swap( tmp );
				}
				else if( identifier == "norm" )
				{
					tmp = std::make_shared<Token>( Token::Type::norm_attr );
					token->swap( tmp );
				}
				else if( identifier == "ptr" )
				{
					tmp = std::make_shared<Token>( Token::Type::type_ptr );
					token->swap( tmp );
				}
				else if( identifier == "if" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_if );
					token->swap( tmp );
				}
				else if( identifier == "else" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_else );
					token->swap( tmp );
				}
				else if( identifier == "while" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_while );
					token->swap( tmp );
				}
				else if( identifier == "for" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_for );
					token->swap( tmp );
				}
				else if( identifier == "do" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_do );
					token->swap( tmp );
				}
				else if( identifier == "break" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_break );
					token->swap( tmp );
				}
				else if( identifier == "return" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_return );
					token->swap( tmp );
				}
				else if( identifier == "new" )
				{
					tmp = std::make_shared<Token>( Token::Type::dy_new );
					token->swap( tmp );
				}
				else if( identifier == "delete" )
				{
					tmp = std::make_shared<Token>( Token::Type::dy_delete );
					token->swap( tmp );
				}
				else if( identifier == "true" )
				{
					tmp = std::make_shared<Token>( Token::Type::literalTrue );
					token->swap( tmp );
				}
				else if( identifier == "false" )
				{
					tmp = std::make_shared<Token>( Token::Type::literalFalse );
					token->swap( tmp );
				}
			}
			else if( ( *token )->type == Token::Type::operatorToken )
			{
				String identifier = ( *token )->as<Token_Operator>()->operatorToken;

				if( identifier.size() > 1 )
				{//May have to be splitted
					if( identifier.substr( 0, 3 ) == "<<=" || identifier.substr( 0, 3 ) == ">>=" )
					{
						if( identifier.size() > 3 )
						{//Split
							splitToken( identifier, 3, token, base.lexerStruct );
						}
					}
					else if( identifier.substr( 0, 2 ) == "&&" || identifier.substr( 0, 2 ) == "||" || identifier.substr( 0, 2 ) == "<<" || identifier.substr( 0, 2 ) == ">>" || identifier.substr( 0, 2 ) == ">=" || identifier.substr( 0, 2 ) == "<=" || identifier.substr( 0, 2 ) == "++" || identifier.substr( 0, 2 ) == "--" || identifier.substr( 0, 2 ) == "==" || identifier.substr( 0, 2 ) == "!=" || identifier.substr( 0, 2 ) == "+=" || identifier.substr( 0, 2 ) == "-=" || identifier.substr( 0, 2 ) == "*=" || identifier.substr( 0, 2 ) == "/=" || identifier.substr( 0, 2 ) == "%=" || identifier.substr( 0, 2 ) == "&=" || identifier.substr( 0, 2 ) == "|=" || identifier.substr( 0, 2 ) == "^=" )
					{
						if( identifier.size() > 2 )
						{//Split
							splitToken( identifier, 2, token, base.lexerStruct );
						}
					}

					if( identifier == "+=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_add_set );
						token->swap( tmp );
					}
					else if( identifier == "-=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_sub_set );
						token->swap( tmp );
					}
					else if( identifier == "*=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_mul_set );
						token->swap( tmp );
					}
					else if( identifier == "/=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_div_set );
						token->swap( tmp );
					}
					else if( identifier == "%=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_mod_set );
						token->swap( tmp );
					}
					else if( identifier == "==" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_eql );
						token->swap( tmp );
					}
					else if( identifier == "!=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_not_eql );
						token->swap( tmp );
					}
					else if( identifier == "<=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_less_eql );
						token->swap( tmp );
					}
					else if( identifier == ">=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_more_eql );
						token->swap( tmp );
					}
					else if( identifier == "&=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_and_set );
						token->swap( tmp );
					}
					else if( identifier == "|=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_or_set );
						token->swap( tmp );
					}
					else if( identifier == "^=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_xor_set );
						token->swap( tmp );
					}
					else if( identifier == "&&" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_and_log );
						token->swap( tmp );
					}
					else if( identifier == "||" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_or_log );
						token->swap( tmp );
					}
					else if( identifier == "<<" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_shift_left );
						token->swap( tmp );
					}
					else if( identifier == ">>" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_shift_right );
						token->swap( tmp );
					}
					else if( identifier == "<<=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_shift_left_set );
						token->swap( tmp );
					}
					else if( identifier == ">>=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_shift_right_set );
						token->swap( tmp );
					}
					else if( identifier == "++" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_inc );
						token->swap( tmp );
					}
					else if( identifier == "--" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_dec );
						token->swap( tmp );
					}
					else
					{//Split
						splitToken( identifier, 1, token, base.lexerStruct );
					}
				}
				if( identifier.size() == 1 )
				{//Single char operators
					String identifier = ( *token )->as<Token_Operator>()->operatorToken;

					if( identifier == "+" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_add );
						token->swap( tmp );
					}
					else if( identifier == "-" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_sub );
						token->swap( tmp );
					}
					else if( identifier == "*" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_mul );
						token->swap( tmp );
					}
					else if( identifier == "/" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_div );
						token->swap( tmp );
					}
					else if( identifier == "%" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_mod );
						token->swap( tmp );
					}
					else if( identifier == "=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_set );
						token->swap( tmp );
					}
					else if( identifier == "<" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_less );
						token->swap( tmp );
					}
					else if( identifier == ">" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_more );
						token->swap( tmp );
					}
					else if( identifier == "!" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_not );
						token->swap( tmp );
					}
					else if( identifier == "&" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_and );
						token->swap( tmp );
					}
					else if( identifier == "|" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_or );
						token->swap( tmp );
					}
					else if( identifier == "^" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_xor );
						token->swap( tmp );
					}
					else if( identifier == "~" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_inv );
						token->swap( tmp );
					}
				}
			}
			else if( ( *token )->type == Token::Type::dividingToken )
			{
				u8 t = ( *token )->as<Token_DividingToken>()->token;

				if( t == '$' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_dollar );
					token->swap( tmp );
				}
				else if( t == '#' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_hash );
					token->swap( tmp );
				}
				else if( t == '(' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_parenthesis_open );
					token->swap( tmp );
				}
				else if( t == ')' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_parenthesis_close );
					token->swap( tmp );
				}
				else if( t == '[' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_bracket_open );
					token->swap( tmp );
				}
				else if( t == ']' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_bracket_close );
					token->swap( tmp );
				}
				else if( t == '{' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_brace_open );
					token->swap( tmp );
				}
				else if( t == '}' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_brace_close );
					token->swap( tmp );
				}
				else if( t == ',' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_comma );
					token->swap( tmp );
				}
				else if( t == '.' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_period );
					token->swap( tmp );
				}
				else if( t == ':' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_colon );
					token->swap( tmp );
				}
				else if( t == ';' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_semicolon );
					token->swap( tmp );
				}
				else if( t == '?' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_questionmark );
					token->swap( tmp );
				}
				else if( t == '@' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_at );
					token->swap( tmp );
				}
				else if( t == '\\' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_backslash );
					token->swap( tmp );
				}
				else if( t == '`' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_grave );
					token->swap( tmp );
				}
			}
			if( tmp != nullptr )
			{//Move also metadata. Use inverted order because of swap
				( *token )->lineNo = tmp->lineNo;
				( *token )->columnNo = tmp->columnNo;
				( *token )->line = tmp->line;
				( *token )->path = tmp->path;
			}
			tmp = nullptr;

			if( ( *token )->type == Token::Type::empty )
			{
				toRemove.push_back( token );
			}
		}

		//Remove empty token, if any
		for( auto &remove : toRemove )
		{
			base.lexerStruct.erase( remove );
		}

		return ExecutionResult::success;
	}